

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O0

int Nm_ManTableDelete(Nm_Man_t *p,int ObjId)

{
  Nm_Entry_t **ppNVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  Nm_Entry_t *pNVar11;
  bool bVar12;
  undefined4 uStack_38;
  int fRemoved;
  Nm_Entry_t *pPrev;
  Nm_Entry_t *pEntry;
  Nm_Entry_t **ppSpot;
  int ObjId_local;
  Nm_Man_t *p_local;
  
  p->nEntries = p->nEntries + -1;
  pNVar11 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar11 == (Nm_Entry_t *)0x0) {
    __assert_fail("Nm_ManTableLookupId(p, ObjId) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x76,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  ppNVar1 = p->pBinsI2N;
  uVar9 = Nm_HashNumber(ObjId,p->nBins);
  for (pEntry = (Nm_Entry_t *)(ppNVar1 + uVar9); *(int *)(*(long *)pEntry + 4) != ObjId;
      pEntry = (Nm_Entry_t *)(*(long *)pEntry + 8)) {
  }
  lVar2 = *(long *)pEntry;
  uVar3 = *(undefined8 *)(*(long *)pEntry + 8);
  pEntry->Type = (int)uVar3;
  pEntry->ObjId = (int)((ulong)uVar3 >> 0x20);
  ppNVar1 = p->pBinsN2I;
  uVar9 = Nm_HashString((char *)(lVar2 + 0x20),p->nBins);
  pEntry = (Nm_Entry_t *)(ppNVar1 + uVar9);
  while( true ) {
    lVar4._0_4_ = pEntry->Type;
    lVar4._4_4_ = pEntry->ObjId;
    bVar12 = false;
    if (lVar4 != 0) {
      lVar5._0_4_ = pEntry->Type;
      lVar5._4_4_ = pEntry->ObjId;
      bVar12 = lVar5 != lVar2;
    }
    if (!bVar12) break;
    pEntry = (Nm_Entry_t *)(*(long *)pEntry + 0x10);
  }
  lVar6._0_4_ = pEntry->Type;
  lVar6._4_4_ = pEntry->ObjId;
  lVar7._0_4_ = pEntry->Type;
  lVar7._4_4_ = pEntry->ObjId;
  if (lVar7 != 0) {
    lVar8._0_4_ = pEntry->Type;
    lVar8._4_4_ = pEntry->ObjId;
    if (lVar8 != lVar2) {
      __assert_fail("*ppSpot == pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x84,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    uVar3 = *(undefined8 *)(*(long *)pEntry + 0x10);
    pEntry->Type = (int)uVar3;
    pEntry->ObjId = (int)((ulong)uVar3 >> 0x20);
  }
  if (*(long *)(lVar2 + 0x18) == 0) {
    if (lVar6 == 0) {
      __assert_fail("fRemoved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8a,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
  }
  else {
    _uStack_38 = lVar2;
    if (*(long *)(lVar2 + 0x18) == lVar2) {
      __assert_fail("pEntry->pNameSake != pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8e,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    for (; *(long *)(_uStack_38 + 0x18) != lVar2; _uStack_38 = *(long *)(_uStack_38 + 0x18)) {
    }
    iVar10 = strcmp((char *)(_uStack_38 + 0x20),(char *)(lVar2 + 0x20));
    if (iVar10 != 0) {
      __assert_fail("!strcmp(pPrev->Name, pEntry->Name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x90,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    if (*(long *)(_uStack_38 + 0x18) != lVar2) {
      __assert_fail("pPrev->pNameSake == pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x91,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    if (*(long *)(lVar2 + 0x18) == _uStack_38) {
      *(undefined8 *)(_uStack_38 + 0x18) = 0;
    }
    else {
      *(undefined8 *)(_uStack_38 + 0x18) = *(undefined8 *)(lVar2 + 0x18);
    }
    if (lVar6 != 0) {
      if (*(long *)(_uStack_38 + 0x10) != 0) {
        __assert_fail("pPrev->pNextN2I == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                      ,0x99,"int Nm_ManTableDelete(Nm_Man_t *, int)");
      }
      *(undefined8 *)(_uStack_38 + 0x10) = *(undefined8 *)pEntry;
      pEntry->Type = uStack_38;
      pEntry->ObjId = fRemoved;
    }
  }
  return 1;
}

Assistant:

int Nm_ManTableDelete( Nm_Man_t * p, int ObjId )
{
    Nm_Entry_t ** ppSpot, * pEntry, * pPrev;
    int fRemoved;
    p->nEntries--;
    // remove the entry from the table Id->Name
    assert( Nm_ManTableLookupId(p, ObjId) != NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(ObjId, p->nBins);
    while ( (*ppSpot)->ObjId != (unsigned)ObjId )
        ppSpot = &(*ppSpot)->pNextI2N;
    pEntry = *ppSpot; 
    *ppSpot = (*ppSpot)->pNextI2N;
    // remove the entry from the table Name->Id
    ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
    while ( *ppSpot && *ppSpot != pEntry )
        ppSpot = &(*ppSpot)->pNextN2I;
    // remember if we found this one in the list
    fRemoved = (*ppSpot != NULL);
    if ( *ppSpot )
    {
        assert( *ppSpot == pEntry );
        *ppSpot = (*ppSpot)->pNextN2I;
    }
    // quit if this entry has no namesakes
    if ( pEntry->pNameSake == NULL )
    {
        assert( fRemoved );
        return 1;
    }
    // remove entry from the ring of namesakes
    assert( pEntry->pNameSake != pEntry );
    for ( pPrev = pEntry; pPrev->pNameSake != pEntry; pPrev = pPrev->pNameSake );
    assert( !strcmp(pPrev->Name, pEntry->Name) );
    assert( pPrev->pNameSake == pEntry );
    if ( pEntry->pNameSake == pPrev ) // two entries in the ring
        pPrev->pNameSake = NULL;
    else
        pPrev->pNameSake = pEntry->pNameSake;
    // reinsert the ring back if we removed its connection with the list in the table
    if ( fRemoved )
    {
        assert( pPrev->pNextN2I == NULL );
        pPrev->pNextN2I = *ppSpot;
        *ppSpot = pPrev;
    }
    return 1;
}